

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

uint __thiscall
CVmObjIterLookupTable::find_first_valid_entry(CVmObjIterLookupTable *this,uint entry)

{
  uint *puVar1;
  uint uVar2;
  vm_val_t coll;
  vm_val_t local_20;
  
  get_coll_val(this,&local_20);
  puVar1 = *(uint **)((long)&G_obj_table_X.pages_[local_20.val.obj >> 0xc][local_20.val.obj & 0xfff]
                             .ptr_ + 8);
  uVar2 = 0;
  if (entry <= puVar1[1]) {
    while ((uVar2 = 0, entry <= puVar1[1] &&
           (uVar2 = entry, puVar1[(ulong)*puVar1 * 2 + (ulong)(entry - 1) * 10 + 8] == 0xd))) {
      entry = entry + 1;
    }
  }
  return uVar2;
}

Assistant:

uint CVmObjIterLookupTable::find_first_valid_entry(VMG_ uint entry) const
{
    CVmObjLookupTable *ltab;
    vm_val_t coll;

    /* get my lookup table object */
    get_coll_val(&coll);
    ltab = (CVmObjLookupTable *)vm_objp(vmg_ coll.val.obj);

    /* if we're already past the last item, we have nothing to find */
    if (entry > ltab->get_entry_count())
        return 0;

    /* 
     *   scan entries until we find one with a non-empty key (an empty key
     *   value indicates that the entry is free) 
     */
    for ( ; entry <= ltab->get_entry_count() ; ++entry)
    {
        vm_lookup_val *entryp;

        /* translate the 1-based index to an entry pointer */
        entryp = ltab->get_ext()->idx_to_val(entry - 1);

        /* if it's non-empty, this is the one we want */
        if (entryp->key.typ != VM_EMPTY)
            return entry;
    }

    /* we didn't find a valid entry */
    return 0;
}